

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

bool __thiscall SQCompiler::Compile(SQCompiler *this,SQObjectPtr *o)

{
  SQFuncState *pSVar1;
  int iVar2;
  SQString *pSVar3;
  SQInteger n;
  SQFunctionProto *x;
  SQObject SVar4;
  _HashNode **local_2e0;
  SQInteger stacksize;
  SQObjectValue local_258;
  SQObject local_250 [2];
  undefined1 local_230 [8];
  SQFuncState funcstate;
  SQObjectPtr *o_local;
  SQCompiler *this_local;
  
  this->_debugline = 1;
  this->_debugop = 0;
  funcstate._ss = (SQSharedState *)o;
  SQFuncState::SQFuncState
            ((SQFuncState *)local_230,this->_vm->_sharedstate,(SQFuncState *)0x0,ThrowError,this);
  pSVar3 = SQString::Create(this->_vm->_sharedstate,"main",-1);
  ::SQObjectPtr::operator=((SQObjectPtr *)&funcstate._strings.super_SQObject._unVal,pSVar3);
  this->_fs = (SQFuncState *)local_230;
  pSVar1 = this->_fs;
  SVar4 = SQFuncState::CreateString(pSVar1,"this",-1);
  local_250[0]._unVal = SVar4._unVal;
  local_250[0]._type = SVar4._type;
  SQFuncState::AddParameter(pSVar1,local_250);
  pSVar1 = this->_fs;
  SVar4 = SQFuncState::CreateString(pSVar1,"vargv",-1);
  local_258 = SVar4._unVal;
  stacksize._0_4_ = SVar4._type;
  SQFuncState::AddParameter(pSVar1,(SQObject *)&stacksize);
  this->_fs->_varparams = true;
  ::SQObjectPtr::operator=(&this->_fs->_sourcename,&this->_sourcename);
  n = SQFuncState::GetStackSize(this->_fs);
  iVar2 = _setjmp((__jmp_buf_tag *)this->_errorjmp);
  if (iVar2 == 0) {
    Lex(this);
    while (0 < this->_token) {
      Statement(this,true);
      if (((this->_lex)._prevtoken != 0x7d) && ((this->_lex)._prevtoken != 0x3b)) {
        OptionalSemicolon(this);
      }
    }
    SQFuncState::SetStackSize(this->_fs,n);
    SQFuncState::AddLineInfos(this->_fs,(this->_lex)._currentline,(bool)(this->_lineinfo & 1),true);
    SQFuncState::AddInstruction(this->_fs,_OP_RETURN,0xff,0,0,0);
    SQFuncState::SetStackSize(this->_fs,0);
    x = SQFuncState::BuildProto(this->_fs);
    ::SQObjectPtr::operator=((SQObjectPtr *)funcstate._ss,x);
    this_local._7_1_ = true;
  }
  else {
    if (((this->_raiseerror & 1U) != 0) &&
       (this->_vm->_sharedstate->_compilererrorhandler != (SQCOMPILERERROR)0x0)) {
      if ((this->_sourcename).super_SQObject._type == OT_STRING) {
        local_2e0 = &((this->_sourcename).super_SQObject._unVal.pTable)->_firstfree;
      }
      else {
        local_2e0 = (_HashNode **)0x14fa84;
      }
      (*this->_vm->_sharedstate->_compilererrorhandler)
                (this->_vm,this->_compilererror,(SQChar *)local_2e0,(this->_lex)._currentline,
                 (this->_lex)._currentcolumn);
    }
    pSVar3 = SQString::Create(this->_vm->_sharedstate,this->_compilererror,-1);
    ::SQObjectPtr::operator=(&this->_vm->_lasterror,pSVar3);
    this_local._7_1_ = false;
  }
  SQFuncState::~SQFuncState((SQFuncState *)local_230);
  return this_local._7_1_;
}

Assistant:

bool Compile(SQObjectPtr &o)
    {
        _debugline = 1;
        _debugop = 0;

        SQFuncState funcstate(_ss(_vm), NULL,ThrowError,this);
        funcstate._name = SQString::Create(_ss(_vm), _SC("main"));
        _fs = &funcstate;
        _fs->AddParameter(_fs->CreateString(_SC("this")));
        _fs->AddParameter(_fs->CreateString(_SC("vargv")));
        _fs->_varparams = true;
        _fs->_sourcename = _sourcename;
        SQInteger stacksize = _fs->GetStackSize();
        if(setjmp(_errorjmp) == 0) {
            Lex();
            while(_token > 0){
                Statement();
                if(_lex._prevtoken != _SC('}') && _lex._prevtoken != _SC(';')) OptionalSemicolon();
            }
            _fs->SetStackSize(stacksize);
            _fs->AddLineInfos(_lex._currentline, _lineinfo, true);
            _fs->AddInstruction(_OP_RETURN, 0xFF);
            _fs->SetStackSize(0);
            o =_fs->BuildProto();
#ifdef _DEBUG_DUMP
            _fs->Dump(_funcproto(o));
#endif
        }
        else {
            if(_raiseerror && _ss(_vm)->_compilererrorhandler) {
                _ss(_vm)->_compilererrorhandler(_vm, _compilererror, type(_sourcename) == OT_STRING?_stringval(_sourcename):_SC("unknown"),
                    _lex._currentline, _lex._currentcolumn);
            }
            _vm->_lasterror = SQString::Create(_ss(_vm), _compilererror, -1);
            return false;
        }
        return true;
    }